

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O0

void mqc_codelps(opj_mqc_t *mqc)

{
  int *in_RDI;
  
  in_RDI[1] = in_RDI[1] - *(int *)**(undefined8 **)(in_RDI + 0x30);
  if ((uint)in_RDI[1] < *(uint *)**(undefined8 **)(in_RDI + 0x30)) {
    *in_RDI = *(int *)**(undefined8 **)(in_RDI + 0x30) + *in_RDI;
  }
  else {
    in_RDI[1] = *(int *)**(undefined8 **)(in_RDI + 0x30);
  }
  **(undefined8 **)(in_RDI + 0x30) = *(undefined8 *)(**(long **)(in_RDI + 0x30) + 0x10);
  mqc_renorme((opj_mqc_t *)0x2e25f4);
  return;
}

Assistant:

static void mqc_codelps(opj_mqc_t *mqc) {
	mqc->a -= (*mqc->curctx)->qeval;
	if (mqc->a < (*mqc->curctx)->qeval) {
		mqc->c += (*mqc->curctx)->qeval;
	} else {
		mqc->a = (*mqc->curctx)->qeval;
	}
	*mqc->curctx = (*mqc->curctx)->nlps;
	mqc_renorme(mqc);
}